

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O3

bool __thiscall
HighsCliqueTable::foundCover
          (HighsCliqueTable *this,HighsDomain *globaldom,CliqueVar v1,CliqueVar v2)

{
  pointer *ppCVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  CliqueVar CVar6;
  pointer pCVar7;
  iterator __position;
  HighsInt cliqueid;
  CliqueVar *__args;
  uint col;
  long lVar8;
  int iVar9;
  bool bVar10;
  double val;
  
  cliqueid = findCommonCliqueId(this,&this->numNeighbourhoodQueries,v1,v2);
  bVar10 = cliqueid != -1;
  if (bVar10) {
    do {
      pCVar7 = (this->cliques).
               super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar5 = pCVar7[cliqueid].start;
      iVar9 = pCVar7[cliqueid].end;
      if (iVar9 != iVar5) {
        lVar8 = (long)iVar5 << 2;
        iVar9 = iVar9 - iVar5;
        do {
          CVar6 = *(CliqueVar *)
                   (&((this->cliqueentries).
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + lVar8);
          if (CVar6 != v2 && CVar6 != v1) {
            col = (uint)CVar6 & 0x7fffffff;
            dVar2 = (globaldom->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[col];
            dVar3 = (globaldom->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[col];
            val = 1.0;
            if ((int)CVar6 < 0) {
              val = 0.0;
            }
            HighsDomain::fixCol(globaldom,col,val,(Reason)0xfffffffe);
            bVar4 = globaldom->infeasible_;
            if (dVar2 != dVar3 && bVar4 == false) {
              this->nfixings = this->nfixings + 1;
              __args = (CliqueVar *)
                       (&((this->cliqueentries).
                          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + lVar8);
              __position._M_current =
                   (this->infeasvertexstack).
                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this->infeasvertexstack).
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                ::_M_realloc_insert<HighsCliqueTable::CliqueVar&>
                          ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                            *)&this->infeasvertexstack,__position,__args);
              }
              else {
                *__position._M_current = *__args;
                ppCVar1 = &(this->infeasvertexstack).
                           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppCVar1 = *ppCVar1 + 1;
              }
            }
            if (bVar4 != false) {
              return true;
            }
          }
          lVar8 = lVar8 + 4;
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
      removeClique(this,cliqueid);
      cliqueid = findCommonCliqueId(this,&this->numNeighbourhoodQueries,v1,v2);
    } while (cliqueid != -1);
  }
  processInfeasibleVertices(this,globaldom);
  return bVar10;
}

Assistant:

bool HighsCliqueTable::foundCover(HighsDomain& globaldom, CliqueVar v1,
                                  CliqueVar v2) {
  bool equality = false;
  HighsInt commonclique = findCommonCliqueId(v1, v2);
  if (commonclique != -1) equality = true;

  while (commonclique != -1) {
    HighsInt start = cliques[commonclique].start;
    HighsInt end = cliques[commonclique].end;

    for (HighsInt i = start; i != end; ++i) {
      if (cliqueentries[i] == v1 || cliqueentries[i] == v2) continue;

      bool wasfixed = globaldom.isFixed(cliqueentries[i].col);
      globaldom.fixCol(cliqueentries[i].col, 1 - cliqueentries[i].val);
      if (globaldom.infeasible()) return equality;
      if (!wasfixed) {
        ++nfixings;
        infeasvertexstack.emplace_back(cliqueentries[i]);
      }
    }

    removeClique(commonclique);
    commonclique = findCommonCliqueId(v1, v2);
  }

  processInfeasibleVertices(globaldom);

  return equality;
}